

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  unsigned_short *puVar1;
  FuncState *fs;
  int iVar2;
  BinOpr BVar3;
  TString *pTVar4;
  ushort uVar5;
  UnOpr op;
  BinOpr op_00;
  expdesc v2;
  expdesc local_68;
  
  fs = ls->fs;
  uVar5 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar5;
  if (0x7d < uVar5) {
    errorlimit(fs,0x7d,"C levels");
  }
  iVar2 = (ls->t).token;
  if (iVar2 < 0x7b) {
    if (iVar2 == 0x23) {
      op = OPR_LEN;
      goto LAB_0011ea5a;
    }
    if (iVar2 == 0x2d) {
      op = OPR_MINUS;
      goto LAB_0011ea5a;
    }
    if (iVar2 != 0x40) goto switchD_0011e7ed_caseD_108;
    iVar2 = ls->linenumber;
    pTVar4 = (ls->t).seminfo.ts;
    luaX_next(ls);
    pTVar4 = user_defined_type_name(ls,pTVar4);
    op = OPR_TO_TYPE;
    goto LAB_0011ea69;
  }
  switch(iVar2) {
  case 0x107:
    v->t = -1;
    v->f = -1;
    v->k = VFALSE;
    (v->u).info = 0;
    v->ravi_type_map = 2;
    goto LAB_0011e92b;
  case 0x108:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x116:
  case 0x117:
  case 0x118:
  case 0x119:
  case 0x11b:
  case 0x11c:
  case 0x11d:
  case 0x11e:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x125:
switchD_0011e7ed_caseD_108:
    suffixedexp(ls,v);
    goto LAB_0011e945;
  case 0x109:
    luaX_next(ls);
    body(ls,v,0,ls->linenumber,0);
    goto LAB_0011e945;
  case 0x10f:
    v->t = -1;
    v->f = -1;
    v->k = VNIL;
    (v->u).info = 0;
    v->ravi_type_map = 1;
    goto LAB_0011e92b;
  case 0x110:
    op = OPR_NOT;
    break;
  case 0x115:
    v->t = -1;
    v->f = -1;
    v->k = VTRUE;
    (v->u).info = 0;
    v->ravi_type_map = 4;
    goto LAB_0011e92b;
  case 0x11a:
    if (fs->f->is_vararg == '\0') {
      luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
    }
    iVar2 = luaK_codeABC(fs,OP_VARARG,0,1,0);
    v->t = -1;
    v->f = -1;
    v->k = VVARARG;
    (v->u).info = iVar2;
    v->ravi_type_map = 0xffffffff;
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
    goto LAB_0011e93d;
  case 0x123:
    v->t = -1;
    v->f = -1;
    v->k = VKFLT;
    (v->u).info = 0;
    v->ravi_type_map = 0x10;
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
    (v->u).ival = (lua_Integer)(ls->t).seminfo;
    goto LAB_0011e93d;
  case 0x124:
    v->t = -1;
    v->f = -1;
    v->k = VKINT;
    (v->u).info = 0;
    v->ravi_type_map = 8;
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
    (v->u).ival = (lua_Integer)(ls->t).seminfo;
    goto LAB_0011e93d;
  case 0x126:
    iVar2 = luaK_stringK(fs,(ls->t).seminfo.ts);
    v->t = -1;
    v->f = -1;
    v->k = VK;
    (v->u).info = iVar2;
    v->ravi_type_map = 0x100;
LAB_0011e92b:
    v->usertype = (TString *)0x0;
    v->pc = -1;
    (v->u).ind.usertype = (TString *)0x0;
LAB_0011e93d:
    luaX_next(ls);
LAB_0011e945:
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(ls->fs,"subexpr -> simpleexpr %e\n",v);
    }
    goto LAB_0011ea91;
  case 0x127:
    op = OPR_TO_INTEGER;
    break;
  case 0x128:
    op = OPR_TO_NUMBER;
    break;
  case 0x129:
    op = OPR_TO_INTARRAY;
    break;
  case 0x12a:
    op = OPR_TO_NUMARRAY;
    break;
  case 299:
    op = OPR_TO_TABLE;
    break;
  case 300:
    op = OPR_TO_STRING;
    break;
  case 0x12d:
    op = OPR_TO_CLOSURE;
    break;
  default:
    if (iVar2 != 0x7b) {
      if (iVar2 == 0x7e) {
        op = OPR_BNOT;
        break;
      }
      goto switchD_0011e7ed_caseD_108;
    }
    constructor(ls,v);
    goto LAB_0011e945;
  }
LAB_0011ea5a:
  iVar2 = ls->linenumber;
  luaX_next(ls);
  pTVar4 = (TString *)0x0;
LAB_0011ea69:
  subexpr(ls,v,0xc);
  luaK_prefix(ls->fs,op,v,iVar2,pTVar4);
LAB_0011ea91:
  iVar2 = (ls->t).token;
  op_00 = OPR_NOBINOPR;
  if (iVar2 < 0x7e) {
    if (iVar2 < 0x3c) {
      switch(iVar2) {
      case 0x25:
        op_00 = OPR_MOD;
        break;
      case 0x26:
        op_00 = OPR_BAND;
        break;
      default:
        goto switchD_0011eabe_caseD_27;
      case 0x2a:
        op_00 = OPR_MUL;
        break;
      case 0x2b:
        op_00 = OPR_ADD;
        break;
      case 0x2d:
        op_00 = OPR_SUB;
        break;
      case 0x2f:
        op_00 = OPR_DIV;
      }
    }
    else if (iVar2 < 0x5e) {
      if (iVar2 == 0x3c) {
        op_00 = OPR_LT;
      }
      else {
        if (iVar2 != 0x3e) goto switchD_0011eabe_caseD_27;
        op_00 = OPR_GT;
      }
    }
    else if (iVar2 == 0x5e) {
      op_00 = OPR_POW;
    }
    else {
      if (iVar2 != 0x7c) goto switchD_0011eabe_caseD_27;
      op_00 = OPR_BOR;
    }
  }
  else {
    switch(iVar2) {
    case 0x111:
      op_00 = OPR_OR;
      break;
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x117:
    case 0x11a:
      goto switchD_0011eabe_caseD_27;
    case 0x118:
      op_00 = OPR_IDIV;
      break;
    case 0x119:
      op_00 = OPR_CONCAT;
      break;
    case 0x11b:
      op_00 = OPR_EQ;
      break;
    case 0x11c:
      op_00 = OPR_GE;
      break;
    case 0x11d:
      op_00 = OPR_LE;
      break;
    case 0x11e:
      op_00 = OPR_NE;
      break;
    case 0x11f:
      op_00 = OPR_SHL;
      break;
    case 0x120:
      op_00 = OPR_SHR;
      break;
    default:
      if (iVar2 == 0x7e) {
        op_00 = OPR_BXOR;
      }
      else {
        if (iVar2 != 0x101) goto switchD_0011eabe_caseD_27;
        op_00 = OPR_AND;
      }
    }
  }
  do {
    if ((int)(uint)priority[op_00].left <= limit) goto switchD_0011eabe_caseD_27;
    local_68.usertype = (TString *)0x0;
    local_68.k = VVOID;
    local_68._4_4_ = 0;
    local_68.u.ival = 0;
    local_68.u.ind.usertype = (TString *)0x0;
    local_68.t = 0;
    local_68.f = 0;
    local_68.ravi_type_map = 0xffffffff;
    local_68._36_4_ = 0;
    local_68.pc = -1;
    local_68._52_4_ = 0;
    iVar2 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,op_00,v);
    BVar3 = subexpr(ls,&local_68,(uint)priority[op_00].right);
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(ls->fs,"subexpr-> %e binop(%d) %e\n",v,(ulong)op_00,&local_68);
    }
    luaK_posfix(ls->fs,op_00,v,&local_68,iVar2);
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(ls->fs,"subexpr-> after posfix %e\n",v);
    }
    op_00 = BVar3;
  } while (BVar3 != OPR_NOBINOPR);
  op_00 = OPR_NOBINOPR;
switchD_0011eabe_caseD_27:
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op_00;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    int line = ls->linenumber;
	// RAVI change - get usertype if @<name>
    TString *usertype = NULL;
    if (uop == OPR_TO_TYPE) {
      usertype = ls->t.seminfo.ts;
      luaX_next(ls);
      // Check and expand to extended name if necessary
      usertype = user_defined_type_name(ls, usertype);
    }
    else {
      luaX_next(ls);
    }
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line, usertype);
  }
  else {
    simpleexp(ls, v);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr -> simpleexpr %e\n", v));
  }
  /* expand while operators have priorities higher than 'limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2 = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> %e binop(%d) %e\n", v, (int)op, &v2));
    
    luaK_posfix(ls->fs, op, v, &v2, line);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> after posfix %e\n", v));
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}